

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboMultisampleTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::BasicFboMultisampleCase::render(BasicFboMultisampleCase *this,Surface *dst)

{
  ContextWrapper *this_00;
  int srcY1;
  bool bVar1;
  bool bVar2;
  ChannelOrder CVar3;
  DataType DVar4;
  deUint32 program;
  uint uVar5;
  Context *pCVar7;
  int ndx_1;
  deUint32 *renderbuffers;
  int ndx;
  int iVar8;
  deUint32 *framebuffers;
  deUint32 *renderbuffers_00;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  deUint32 resolveFbo;
  Vector<float,_4> res;
  deUint32 msaaFbo;
  Random rnd;
  deUint32 resolveDepthStencilRbo;
  deUint32 msaaDepthStencilRbo;
  deUint32 resolveColorRbo;
  deUint32 msaaColorRbo;
  float local_388;
  TextureFormat colorFmt;
  Vec3 local_36c;
  Surface *local_360;
  TextureFormatInfo colorFmtInfo;
  FlatColorShader flatShader;
  GradientShader gradShader;
  TextureFormat TVar6;
  
  colorFmt = glu::mapGLInternalFormat(this->m_colorFormat);
  if (this->m_depthStencilFormat == 0) {
    CVar3 = CHANNELORDER_LAST;
  }
  else {
    TVar6 = glu::mapGLInternalFormat(this->m_depthStencilFormat);
    CVar3 = TVar6.order;
  }
  tcu::getTextureFormatInfo(&colorFmtInfo,&colorFmt);
  DVar4 = FboTestUtil::getFragmentOutputType(&colorFmt);
  FboTestUtil::GradientShader::GradientShader(&gradShader,DVar4);
  DVar4 = FboTestUtil::getFragmentOutputType(&colorFmt);
  FboTestUtil::FlatColorShader::FlatColorShader(&flatShader,DVar4);
  this_00 = &(this->super_FboTestCase).super_ContextWrapper;
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_388 = (float)(*pCVar7->_vptr_Context[0x75])(pCVar7,&gradShader);
  local_360 = dst;
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  program = (*pCVar7->_vptr_Context[0x75])(pCVar7,&flatShader);
  uVar5 = CVar3 - S;
  msaaFbo = 0;
  resolveFbo = 0;
  msaaColorRbo = 0;
  resolveColorRbo = 0;
  msaaDepthStencilRbo = 0;
  resolveDepthStencilRbo = 0;
  bVar2 = true;
  do {
    bVar1 = bVar2;
    framebuffers = &resolveFbo;
    if (bVar1) {
      framebuffers = &msaaFbo;
    }
    renderbuffers = &resolveColorRbo;
    if (bVar1) {
      renderbuffers = &msaaColorRbo;
    }
    renderbuffers_00 = &resolveDepthStencilRbo;
    if (bVar1) {
      renderbuffers_00 = &msaaDepthStencilRbo;
    }
    iVar8 = this->m_numSamples;
    if (!bVar1) {
      iVar8 = 0;
    }
    sglr::ContextWrapper::glGenRenderbuffers(this_00,1,renderbuffers);
    sglr::ContextWrapper::glBindRenderbuffer(this_00,0x8d41,*renderbuffers);
    sglr::ContextWrapper::glRenderbufferStorageMultisample
              (this_00,0x8d41,iVar8,this->m_colorFormat,(this->m_size).m_data[0],
               (this->m_size).m_data[1]);
    if (((CVar3 == D) || (CVar3 == DS)) || (uVar5 < 2)) {
      sglr::ContextWrapper::glGenRenderbuffers(this_00,1,renderbuffers_00);
      sglr::ContextWrapper::glBindRenderbuffer(this_00,0x8d41,*renderbuffers_00);
      sglr::ContextWrapper::glRenderbufferStorageMultisample
                (this_00,0x8d41,iVar8,this->m_depthStencilFormat,(this->m_size).m_data[0],
                 (this->m_size).m_data[1]);
    }
    sglr::ContextWrapper::glGenFramebuffers(this_00,1,framebuffers);
    sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,*framebuffers);
    sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8ce0,0x8d41,*renderbuffers);
    if ((CVar3 == DS) || (CVar3 == D)) {
      sglr::ContextWrapper::glFramebufferRenderbuffer
                (this_00,0x8d40,0x8d00,0x8d41,*renderbuffers_00);
    }
    if (uVar5 < 2) {
      sglr::ContextWrapper::glFramebufferRenderbuffer
                (this_00,0x8d40,0x8d20,0x8d41,*renderbuffers_00);
    }
    FboTestCase::checkError(&this->super_FboTestCase);
    FboTestCase::checkFramebufferStatus(&this->super_FboTestCase,0x8d40);
    bVar2 = false;
  } while (bVar1);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,msaaFbo);
  fVar9 = local_388;
  sglr::ContextWrapper::glViewport(this_00,0,0,(this->m_size).m_data[0],(this->m_size).m_data[1]);
  sglr::ContextWrapper::glClearBufferfi(this_00,0x84f9,0,1.0,0);
  sglr::ContextWrapper::glEnable(this_00,0xb71);
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  FboTestUtil::GradientShader::setGradient
            (&gradShader,pCVar7,(deUint32)fVar9,&colorFmtInfo.valueMin,&colorFmtInfo.valueMax);
  pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
  rnd.m_rnd.x = 0xbf800000;
  rnd.m_rnd.y = 0xbf800000;
  rnd.m_rnd.z = 0xbf800000;
  res.m_data[0] = 1.0;
  res.m_data[1] = 1.0;
  res.m_data[2] = 1.0;
  sglr::drawQuad(pCVar7,(deUint32)fVar9,(Vec3 *)&rnd,(Vec3 *)&res);
  deRandom_init(&rnd.m_rnd,9);
  sglr::ContextWrapper::glDepthFunc(this_00,0x207);
  sglr::ContextWrapper::glEnable(this_00,0xb90);
  sglr::ContextWrapper::glStencilFunc(this_00,0x207,0,0xff);
  sglr::ContextWrapper::glStencilOp(this_00,0x1e00,0x1e00,0x1e02);
  iVar8 = 8;
  do {
    local_388 = deRandom_getFloat(&rnd.m_rnd);
    fVar9 = deRandom_getFloat(&rnd.m_rnd);
    fVar10 = deRandom_getFloat(&rnd.m_rnd);
    fVar11 = deRandom_getFloat(&rnd.m_rnd);
    fVar12 = deRandom_getFloat(&rnd.m_rnd);
    fVar13 = deRandom_getFloat(&rnd.m_rnd);
    fVar14 = deRandom_getFloat(&rnd.m_rnd);
    fVar15 = deRandom_getFloat(&rnd.m_rnd);
    fVar16 = deRandom_getFloat(&rnd.m_rnd);
    fVar17 = deRandom_getFloat(&rnd.m_rnd);
    pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
    res.m_data[2] =
         (colorFmtInfo.valueMax.m_data[2] - colorFmtInfo.valueMin.m_data[2]) * fVar10 +
         colorFmtInfo.valueMin.m_data[2];
    res.m_data[3] =
         (colorFmtInfo.valueMax.m_data[3] - colorFmtInfo.valueMin.m_data[3]) * fVar11 +
         colorFmtInfo.valueMin.m_data[3];
    res.m_data[1] =
         (colorFmtInfo.valueMax.m_data[1] - colorFmtInfo.valueMin.m_data[1]) * fVar9 +
         colorFmtInfo.valueMin.m_data[1];
    res.m_data[0] =
         (colorFmtInfo.valueMax.m_data[0] - colorFmtInfo.valueMin.m_data[0]) * local_388 +
         colorFmtInfo.valueMin.m_data[0];
    FboTestUtil::FlatColorShader::setColor(&flatShader,pCVar7,program,&res);
    pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
    res.m_data[1] = fVar13 + fVar13 + -1.0;
    res.m_data[0] = fVar12 + fVar12 + -1.0;
    res.m_data[2] = fVar14 + fVar14 + -1.0;
    local_36c.m_data[0] = fVar15 + fVar15 + -1.0;
    local_36c.m_data[1] = fVar16 + fVar16 + -1.0;
    local_36c.m_data[2] = fVar17 + fVar17 + -1.0;
    sglr::drawQuad(pCVar7,program,(Vec3 *)&res,&local_36c);
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  sglr::ContextWrapper::glDisable(this_00,0xb71);
  sglr::ContextWrapper::glDisable(this_00,0xb90);
  FboTestCase::checkError(&this->super_FboTestCase);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8ca9,resolveFbo);
  iVar8 = (this->m_size).m_data[0];
  srcY1 = (this->m_size).m_data[1];
  sglr::ContextWrapper::glBlitFramebuffer
            (this_00,0,0,iVar8,srcY1,0,0,iVar8,srcY1,
             (uint)(uVar5 < 2) * 0x400 + (uint)((CVar3 - D & 0xfffffffd) == 0) * 0x100 + 0x4000,
             0x2600);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8ca8,resolveFbo);
  if ((CVar3 == DS) || (CVar3 == D)) {
    sglr::ContextWrapper::glEnable(this_00,0xb71);
    sglr::ContextWrapper::glDepthFunc(this_00,0x201);
    sglr::ContextWrapper::glDepthMask(this_00,0);
    iVar8 = 0;
    sglr::ContextWrapper::glColorMask(this_00,0,0,1,0);
    do {
      local_388 = (float)iVar8 * 0.25 + -1.0;
      pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
      rnd.m_rnd.z = (deUint32)
                    ((colorFmtInfo.valueMax.m_data[2] - colorFmtInfo.valueMin.m_data[2]) *
                     ((float)iVar8 / 7.0) + colorFmtInfo.valueMin.m_data[2]);
      rnd.m_rnd.w = (deUint32)
                    ((colorFmtInfo.valueMax.m_data[3] - colorFmtInfo.valueMin.m_data[3]) * 1.0 +
                    colorFmtInfo.valueMin.m_data[3]);
      rnd.m_rnd.y = (deUint32)
                    ((colorFmtInfo.valueMax.m_data[1] - colorFmtInfo.valueMin.m_data[1]) * 0.0 +
                    colorFmtInfo.valueMin.m_data[1]);
      rnd.m_rnd.x = (deUint32)
                    ((colorFmtInfo.valueMax.m_data[0] - colorFmtInfo.valueMin.m_data[0]) * 0.0 +
                    colorFmtInfo.valueMin.m_data[0]);
      FboTestUtil::FlatColorShader::setColor(&flatShader,pCVar7,program,(Vec4 *)&rnd);
      pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
      rnd.m_rnd.x = 0xbf800000;
      rnd.m_rnd.y = 0xbf800000;
      rnd.m_rnd.z = (deUint32)local_388;
      res.m_data[0] = 1.0;
      res.m_data[1] = 1.0;
      res.m_data[2] = local_388;
      sglr::drawQuad(pCVar7,program,(Vec3 *)&rnd,(Vec3 *)&res);
      iVar8 = iVar8 + 1;
    } while (iVar8 != 8);
    sglr::ContextWrapper::glDisable(this_00,0xb71);
  }
  if (uVar5 < 2) {
    sglr::ContextWrapper::glEnable(this_00,0xb90);
    sglr::ContextWrapper::glStencilOp(this_00,0x1e00,0x1e00,0x1e00);
    sglr::ContextWrapper::glColorMask(this_00,0,1,0,0);
    iVar8 = 0;
    do {
      sglr::ContextWrapper::glStencilFunc(this_00,0x202,iVar8,0xff);
      pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
      rnd.m_rnd.z = (deUint32)
                    ((colorFmtInfo.valueMax.m_data[2] - colorFmtInfo.valueMin.m_data[2]) * 0.0 +
                    colorFmtInfo.valueMin.m_data[2]);
      rnd.m_rnd.w = (deUint32)
                    ((colorFmtInfo.valueMax.m_data[3] - colorFmtInfo.valueMin.m_data[3]) * 1.0 +
                    colorFmtInfo.valueMin.m_data[3]);
      rnd.m_rnd.y = (deUint32)
                    ((colorFmtInfo.valueMax.m_data[1] - colorFmtInfo.valueMin.m_data[1]) *
                     ((float)iVar8 / 3.0) + colorFmtInfo.valueMin.m_data[1]);
      rnd.m_rnd.x = (deUint32)
                    ((colorFmtInfo.valueMax.m_data[0] - colorFmtInfo.valueMin.m_data[0]) * 0.0 +
                    colorFmtInfo.valueMin.m_data[0]);
      FboTestUtil::FlatColorShader::setColor(&flatShader,pCVar7,program,(Vec4 *)&rnd);
      pCVar7 = sglr::ContextWrapper::getCurrentContext(this_00);
      rnd.m_rnd.x = 0xbf800000;
      rnd.m_rnd.y = 0xbf800000;
      rnd.m_rnd.z = 0;
      res.m_data[0] = 1.0;
      res.m_data[1] = 1.0;
      res.m_data[2] = 0.0;
      sglr::drawQuad(pCVar7,program,(Vec3 *)&rnd,(Vec3 *)&res);
      iVar8 = iVar8 + 1;
    } while (iVar8 != 4);
    sglr::ContextWrapper::glDisable(this_00,0xb90);
  }
  FboTestCase::readPixels
            (&this->super_FboTestCase,local_360,0,0,(this->m_size).m_data[0],
             (this->m_size).m_data[1],&colorFmt,&colorFmtInfo.lookupScale,&colorFmtInfo.lookupBias);
  sglr::ShaderProgram::~ShaderProgram(&flatShader.super_ShaderProgram);
  sglr::ShaderProgram::~ShaderProgram(&gradShader.super_ShaderProgram);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		tcu::TextureFormat		colorFmt				= glu::mapGLInternalFormat(m_colorFormat);
		tcu::TextureFormat		depthStencilFmt			= m_depthStencilFormat != GL_NONE ? glu::mapGLInternalFormat(m_depthStencilFormat) : tcu::TextureFormat();
		tcu::TextureFormatInfo	colorFmtInfo			= tcu::getTextureFormatInfo(colorFmt);
		bool					depth					= depthStencilFmt.order == tcu::TextureFormat::D || depthStencilFmt.order == tcu::TextureFormat::DS;
		bool					stencil					= depthStencilFmt.order == tcu::TextureFormat::S || depthStencilFmt.order == tcu::TextureFormat::DS;
		GradientShader			gradShader				(getFragmentOutputType(colorFmt));
		FlatColorShader			flatShader				(getFragmentOutputType(colorFmt));
		deUint32				gradShaderID			= getCurrentContext()->createProgram(&gradShader);
		deUint32				flatShaderID			= getCurrentContext()->createProgram(&flatShader);
		deUint32				msaaFbo					= 0;
		deUint32				resolveFbo				= 0;
		deUint32				msaaColorRbo			= 0;
		deUint32				resolveColorRbo			= 0;
		deUint32				msaaDepthStencilRbo		= 0;
		deUint32				resolveDepthStencilRbo	= 0;

		// Create framebuffers.
		for (int ndx = 0; ndx < 2; ndx++)
		{
			deUint32&	fbo				= ndx ? resolveFbo				: msaaFbo;
			deUint32&	colorRbo		= ndx ? resolveColorRbo			: msaaColorRbo;
			deUint32&	depthStencilRbo	= ndx ? resolveDepthStencilRbo	: msaaDepthStencilRbo;
			int			samples			= ndx ? 0						: m_numSamples;

			glGenRenderbuffers(1, &colorRbo);
			glBindRenderbuffer(GL_RENDERBUFFER, colorRbo);
			glRenderbufferStorageMultisample(GL_RENDERBUFFER, samples, m_colorFormat, m_size.x(), m_size.y());

			if (depth || stencil)
			{
				glGenRenderbuffers(1, &depthStencilRbo);
				glBindRenderbuffer(GL_RENDERBUFFER, depthStencilRbo);
				glRenderbufferStorageMultisample(GL_RENDERBUFFER, samples, m_depthStencilFormat, m_size.x(), m_size.y());
			}

			glGenFramebuffers(1, &fbo);
			glBindFramebuffer(GL_FRAMEBUFFER, fbo);
			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, colorRbo);
			if (depth)
				glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, depthStencilRbo);
			if (stencil)
				glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, depthStencilRbo);

			checkError();
			checkFramebufferStatus(GL_FRAMEBUFFER);
		}

		glBindFramebuffer(GL_FRAMEBUFFER, msaaFbo);
		glViewport(0, 0, m_size.x(), m_size.y());

		// Clear depth and stencil buffers.
		glClearBufferfi(GL_DEPTH_STENCIL, 0, 1.0f, 0);

		// Fill MSAA fbo with gradient, depth = [-1..1]
		glEnable(GL_DEPTH_TEST);
		gradShader.setGradient(*getCurrentContext(), gradShaderID, colorFmtInfo.valueMin, colorFmtInfo.valueMax);
		sglr::drawQuad(*getCurrentContext(), gradShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

		// Render random-colored quads.
		{
			const int		numQuads	= 8;
			de::Random		rnd			(9);

			glDepthFunc(GL_ALWAYS);
			glEnable(GL_STENCIL_TEST);
			glStencilFunc(GL_ALWAYS, 0, 0xffu);
			glStencilOp(GL_KEEP, GL_KEEP, GL_INCR);

			for (int ndx = 0; ndx < numQuads; ndx++)
			{
				float	r		= rnd.getFloat();
				float	g		= rnd.getFloat();
				float	b		= rnd.getFloat();
				float	a		= rnd.getFloat();
				float	x0		= rnd.getFloat(-1.0f, 1.0f);
				float	y0		= rnd.getFloat(-1.0f, 1.0f);
				float	z0		= rnd.getFloat(-1.0f, 1.0f);
				float	x1		= rnd.getFloat(-1.0f, 1.0f);
				float	y1		= rnd.getFloat(-1.0f, 1.0f);
				float	z1		= rnd.getFloat(-1.0f, 1.0f);

				flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(r,g,b,a) * (colorFmtInfo.valueMax-colorFmtInfo.valueMin) + colorFmtInfo.valueMin);
				sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(x0, y0, z0), Vec3(x1, y1, z1));
			}
		}

		glDisable(GL_DEPTH_TEST);
		glDisable(GL_STENCIL_TEST);
		checkError();

		// Resolve using glBlitFramebuffer().
		glBindFramebuffer(GL_DRAW_FRAMEBUFFER, resolveFbo);
		glBlitFramebuffer(0, 0, m_size.x(), m_size.y(), 0, 0, m_size.x(), m_size.y(), GL_COLOR_BUFFER_BIT | (depth ? GL_DEPTH_BUFFER_BIT : 0) | (stencil ? GL_STENCIL_BUFFER_BIT : 0), GL_NEAREST);

		glBindFramebuffer(GL_READ_FRAMEBUFFER, resolveFbo);

		if (depth)
		{
			// Visualize depth.
			const int	numSteps	= 8;
			const float	step		= 2.0f / (float)numSteps;

			glEnable(GL_DEPTH_TEST);
			glDepthFunc(GL_LESS);
			glDepthMask(GL_FALSE);
			glColorMask(GL_FALSE, GL_FALSE, GL_TRUE, GL_FALSE);

			for (int ndx = 0; ndx < numSteps; ndx++)
			{
				float d = -1.0f + step*(float)ndx;
				float c = (float)ndx / (float)(numSteps-1);

				flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 0.0f, c, 1.0f) * (colorFmtInfo.valueMax-colorFmtInfo.valueMin) + colorFmtInfo.valueMin);
				sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, d), Vec3(1.0f, 1.0f, d));
			}

			glDisable(GL_DEPTH_TEST);
		}

		if (stencil)
		{
			// Visualize stencil.
			const int	numSteps	= 4;
			const int	step		= 1;

			glEnable(GL_STENCIL_TEST);
			glStencilOp(GL_KEEP, GL_KEEP, GL_KEEP);
			glColorMask(GL_FALSE, GL_TRUE, GL_FALSE, GL_FALSE);

			for (int ndx = 0; ndx < numSteps; ndx++)
			{
				int		s	= step*ndx;
				float	c	= (float)ndx / (float)(numSteps-1);

				glStencilFunc(GL_EQUAL, s, 0xffu);

				flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, c, 0.0f, 1.0f) * (colorFmtInfo.valueMax-colorFmtInfo.valueMin) + colorFmtInfo.valueMin);
				sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
			}

			glDisable(GL_STENCIL_TEST);
		}

		readPixels(dst, 0, 0, m_size.x(), m_size.y(), colorFmt, colorFmtInfo.lookupScale, colorFmtInfo.lookupBias);
	}